

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningAgent.cpp
# Opt level: O0

string * __thiscall
multi_agent_planning::PlanningAgent::planToString_abi_cxx11_
          (string *__return_storage_ptr__,PlanningAgent *this,Plan *plan)

{
  bool bVar1;
  ostream *poVar2;
  pointer pPVar3;
  __normal_iterator<const_multi_agent_planning::PlannedAction_*,_std::vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>_>
  local_1c8;
  __normal_iterator<const_multi_agent_planning::PlannedAction_*,_std::vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>_>
  local_1c0;
  const_iterator it;
  stringstream local_1a8 [8];
  stringstream ss;
  ostream local_198 [376];
  Plan *local_20;
  Plan *plan_local;
  PlanningAgent *this_local;
  
  local_20 = plan;
  plan_local = (Plan *)this;
  this_local = (PlanningAgent *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar2 = std::operator<<(local_198,"Plan for agent ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->agent_id);
  std::operator<<(poVar2,": ");
  local_1c0._M_current =
       (PlannedAction *)
       std::
       vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
       ::begin(&local_20->actions);
  pPVar3 = __gnu_cxx::
           __normal_iterator<const_multi_agent_planning::PlannedAction_*,_std::vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>_>
           ::operator->(&local_1c0);
  poVar2 = (ostream *)std::ostream::operator<<(local_198,pPVar3->source);
  std::operator<<(poVar2," ");
  while( true ) {
    local_1c8._M_current =
         (PlannedAction *)
         std::
         vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>
         ::end(&local_20->actions);
    bVar1 = __gnu_cxx::operator!=(&local_1c0,&local_1c8);
    if (!bVar1) break;
    pPVar3 = __gnu_cxx::
             __normal_iterator<const_multi_agent_planning::PlannedAction_*,_std::vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>_>
             ::operator->(&local_1c0);
    poVar2 = (ostream *)std::ostream::operator<<(local_198,pPVar3->target);
    std::operator<<(poVar2," ");
    __gnu_cxx::
    __normal_iterator<const_multi_agent_planning::PlannedAction_*,_std::vector<multi_agent_planning::PlannedAction,_std::allocator<multi_agent_planning::PlannedAction>_>_>
    ::operator++(&local_1c0);
  }
  poVar2 = std::operator<<(local_198,"  (cost: ");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_20->cost);
  poVar2 = std::operator<<(poVar2,")");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

string PlanningAgent::planToString(const Plan& plan) {
	stringstream ss;

	ss << "Plan for agent " << agent_id << ": ";

	//ss << "  states: ";
	
	auto it = plan.actions.begin();
	ss << it->source << " ";
	for (; it != plan.actions.end(); ++it) {
		ss << it->target << " ";
	}

	//ss << endl;

	/*
	it = plan.actions.begin();
	for (; it != plan.actions.end(); ++it) {
		ss << "time " << it->start_time << ": " << it->edge << endl;
	}
	*/
	

	ss << "  (cost: " << plan.cost << ")" << endl;

	//ss << "------------------------" << endl;

	return ss.str();
}